

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.c
# Opt level: O2

void pcut_failed_assertion_fmt(char *filename,int line,char *fmt,...)

{
  char in_AL;
  int iVar1;
  long lVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  char (*dest) [257];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  dest = message_buffer + (uint)message_buffer_index;
  message_buffer_index = ~message_buffer_index & 1;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  pcut_snprintf(*dest,0x100,"%s:%d: ",filename,(ulong)(uint)line);
  iVar1 = pcut_str_size(*dest);
  lVar2 = (long)iVar1;
  if (lVar2 + 1U < 0x100) {
    local_d8 = local_c8;
    local_e0 = &args[0].overflow_arg_area;
    local_e8 = 0x3000000018;
    vsnprintf(*dest + lVar2,0x100 - lVar2,fmt,&local_e8);
  }
  pcut_failed_assertion(*dest);
  return;
}

Assistant:

void pcut_failed_assertion_fmt(const char *filename, int line, const char *fmt, ...) {
	va_list args;
	char *current_buffer = message_buffer[message_buffer_index];
	size_t offset = 0;
	message_buffer_index = (message_buffer_index + 1) % MESSAGE_BUFFER_COUNT;

	pcut_snprintf(current_buffer, MAX_MESSAGE_LENGTH, "%s:%d: ", filename, line);
	offset = pcut_str_size(current_buffer);

	if (offset + 1 < MAX_MESSAGE_LENGTH) {
		va_start(args, fmt);
		vsnprintf(current_buffer + offset, MAX_MESSAGE_LENGTH - offset, fmt, args);
		va_end(args);
	}

	pcut_failed_assertion(current_buffer);
}